

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O1

bool binlog::operator==(WriterProp *a,WriterProp *b)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  if (a->id != b->id) {
    return false;
  }
  __n = (a->name)._M_string_length;
  if (__n == (b->name)._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((a->name)._M_dataplus._M_p,(b->name)._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_00162b12;
    }
    bVar2 = a->batchSize == b->batchSize;
  }
  else {
LAB_00162b12:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const WriterProp& a, const WriterProp& b)
{
  return a.id == b.id
    &&   a.name == b.name
    &&   a.batchSize == b.batchSize;
}